

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk * modified_chunk(player *p,wchar_t height,wchar_t width,_Bool persistent)

{
  wchar_t m;
  wchar_t wVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined3 uVar8;
  undefined4 uVar9;
  room_profile profile;
  _Bool _Var10;
  wchar_t wVar11;
  uint32_t uVar12;
  chunk *c;
  _Bool **pp_Var13;
  _Bool *p_Var14;
  room_profile *prVar15;
  dun_data *pdVar16;
  int iVar17;
  wchar_t wVar18;
  long lVar19;
  ulong uVar20;
  wchar_t wVar21;
  int local_44;
  
  m = dun->profile->dun_unusual;
  wVar1 = dun->profile->n_room_profiles;
  c = (chunk *)cave_new(height,width);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  wVar11 = c->height;
  wVar21 = c->width;
  uVar2 = (wVar21 * wVar11) / 7;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nfloors=%d",(ulong)(uint)wVar11,(ulong)(uint)wVar21,(ulong)uVar2);
    wVar11 = c->height;
    wVar21 = c->width;
  }
  fill_rectangle(c,L'\0',L'\0',wVar11 + L'\xffffffff',wVar21 + L'\xffffffff',FEAT_GRANITE,L'\0');
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_PERM,L'\0',
                 true);
  pdVar16 = dun;
  wVar11 = c->height / dun->block_hgt;
  dun->row_blocks = wVar11;
  pdVar16->col_blocks = c->width / pdVar16->block_wid;
  pp_Var13 = (_Bool **)mem_zalloc((long)wVar11 << 3);
  pdVar16 = dun;
  dun->room_map = pp_Var13;
  if (L'\0' < pdVar16->row_blocks) {
    lVar19 = 0;
    do {
      p_Var14 = (_Bool *)mem_zalloc((long)pdVar16->col_blocks);
      dun->room_map[lVar19] = p_Var14;
      lVar19 = lVar19 + 1;
      pdVar16 = dun;
    } while (lVar19 < dun->row_blocks);
  }
  pdVar16->pit_num = L'\0';
  pdVar16->cent_n = L'\0';
  reset_entrance_data(c);
  if (persistent) {
    build_staircase_rooms(c,"Modified Generation");
  }
  local_44 = 0;
LAB_0014c352:
  do {
    if (((int)uVar2 <= c->feat_count[FEAT_FLOOR]) && (L'\x01' < dun->cent_n)) {
      if (L'\0' < dun->row_blocks) {
        lVar19 = 0;
        do {
          mem_free(dun->room_map[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 < dun->row_blocks);
      }
      mem_free(dun->room_map);
      do_traditional_tunneling(c);
      ensure_connectedness(c,true);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_GRANITE,
                     L'\0',true);
      return c;
    }
    if (local_44 == 0x1f5) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      return (chunk *)0x0;
    }
    local_44 = local_44 + 1;
    wVar11 = Rand_div(100);
    wVar21 = L'\0';
    do {
      if (dun->profile->max_rarity <= wVar21) goto LAB_0014c3d3;
      uVar12 = Rand_div(m);
      iVar17 = c->depth / 2 + 0x32;
      wVar21 = wVar21 + L'\x01';
    } while ((int)uVar12 < iVar17);
    wVar21 = wVar21 + (uint)((int)uVar12 < iVar17) + L'\xffffffff';
LAB_0014c3d3:
    if (L'\0' < wVar1) {
      uVar20 = 0;
      do {
        prVar15 = dun->profile->room_profiles + uVar20;
        while ((wVar21 < prVar15->rarity || (prVar15->cutoff <= wVar11))) {
          wVar18 = (int)uVar20 + L'\x01';
          uVar20 = (ulong)(uint)wVar18;
          prVar15 = prVar15 + 1;
          if (wVar1 <= wVar18) goto LAB_0014c352;
        }
        uVar3 = prVar15->rating;
        uVar4 = prVar15->height;
        profile.height = uVar4;
        profile.rating = uVar3;
        uVar5 = prVar15->width;
        uVar6 = prVar15->level;
        profile.level = uVar6;
        profile.width = uVar5;
        uVar7 = prVar15->pit;
        uVar8 = *(undefined3 *)&prVar15->field_0x29;
        uVar9 = prVar15->rarity;
        profile.rarity = uVar9;
        profile._41_3_ = uVar8;
        profile.pit = (_Bool)uVar7;
        profile.name._4_4_ = (int)((ulong)prVar15->name >> 0x20);
        profile._0_12_ = *(undefined1 (*) [12])prVar15;
        profile.builder = prVar15->builder;
        profile.cutoff = prVar15->cutoff;
        profile._52_4_ = *(undefined4 *)&prVar15->field_0x34;
        _Var10 = room_build(c,L'\0',L'\0',profile,true);
      } while ((!_Var10) &&
              (wVar18 = (int)uVar20 + L'\x01', uVar20 = (ulong)(uint)wVar18, wVar18 < wVar1));
    }
  } while( true );
}

Assistant:

static struct chunk *modified_chunk(struct player *p, int height, int width,
									bool persistent)
{
	int i;
	int by = 0, bx = 0, key, rarity;
	int num_floors;
	int num_rooms = dun->profile->n_room_profiles;
	int dun_unusual = dun->profile->dun_unusual;
	int n_attempt;

	/* Make the cave */
	struct chunk *c = cave_new(height, width);
	c->depth = p->depth;
	c->place = p->place;

	/* Set the intended number of floor grids based on cave floor area */
	num_floors = c->height * c->width / 7;
	ROOM_LOG("height=%d  width=%d  nfloors=%d", c->height, c->width,num_floors);

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE);

	/* Generate permanent walls around the generated area (temporarily!) */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Actual maximum number of blocks on this level */
	dun->row_blocks = c->height / dun->block_hgt;
	dun->col_blocks = c->width / dun->block_wid;

	/* Initialize the room table */
	dun->room_map = mem_zalloc(dun->row_blocks * sizeof(bool*));
	for (i = 0; i < dun->row_blocks; i++)
		dun->room_map[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* No rooms yet, pits or otherwise. */
	dun->pit_num = 0;
	dun->cent_n = 0;
	reset_entrance_data(c);

	/* Build the special staircase rooms */
	if (persistent) {
		build_staircase_rooms(c, "Modified Generation");
	}

	/*
	 * Build rooms until we have enough floor grids and at least two rooms
	 * or we appear to be stuck and can't match those criteria.
	 */
	n_attempt = 0;
	while (1) {
		if (c->feat_count[FEAT_FLOOR] >= num_floors
				&& dun->cent_n >= 2) {
			break;
		}
		/*
		 * At an average of roughly 22 successful rooms per level
		 * (and a standard deviation of 4.5 or so for that) and a
		 * room failure rate that's less than .5 failures per success
		 * (4.2.x profile doesn't use full allocation for rarity two
		 * rooms - only up to 60; and the last type tried in that
		 * rarity has a failure rate per successful rooms of all types
		 * of around .024).  500 attempts is a generous cutoff for
		 * saying no further progress is likely.
		 */
		if (n_attempt > 500) {
			uncreate_artifacts(c);
			wipe_mon_list(c, p);
			cave_free(c);
			return NULL;
		}
		++n_attempt;

		/* Roll for random key (to be compared against a profile's cutoff) */
		key = randint0(100);

		/* We generate a rarity number to figure out how exotic to make
		 * the room. This number has a (50+depth/2)/DUN_UNUSUAL chance
		 * of being > 0, a (50+depth/2)^2/DUN_UNUSUAL^2 chance of
		 * being > 1, up to MAX_RARITY. */
		i = 0;
		rarity = 0;
		while (i == rarity && i < dun->profile->max_rarity) {
			if (randint0(dun_unusual) < 50 + c->depth / 2) rarity++;
			i++;
		}

		/* Once we have a key and a rarity, we iterate through out list of
		 * room profiles looking for a match (whose cutoff > key and whose
		 * rarity > this rarity). We try building the room, and if it works
		 * then we are done with this iteration. We keep going until we find
		 * a room that we can build successfully or we exhaust the profiles. */
		for (i = 0; i < num_rooms; i++) {
			struct room_profile profile = dun->profile->room_profiles[i];
			if (profile.rarity > rarity) continue;
			if (profile.cutoff <= key) continue;
			if (room_build(c, by, bx, profile, true)) break;
		}
	}

	for (i = 0; i < dun->row_blocks; i++)
		mem_free(dun->room_map[i]);
	mem_free(dun->room_map);

	/* Connect all the rooms together */
	do_traditional_tunneling(c);
	ensure_connectedness(c, true);

	/* Turn the outer permanent walls back to granite */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE, true);

	return c;
}